

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyParser.cpp
# Opt level: O0

bool Assimp::PLY::DOM::ParseInstance
               (IOStreamBuffer<char> *streamBuffer,DOM *p_pcOut,PLYImporter *loader)

{
  bool bVar1;
  Logger *pLVar2;
  undefined1 local_40 [8];
  vector<char,_std::allocator<char>_> buffer;
  PLYImporter *loader_local;
  DOM *p_pcOut_local;
  IOStreamBuffer<char> *streamBuffer_local;
  
  buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ = loader;
  if (p_pcOut == (DOM *)0x0) {
    __assert_fail("__null != p_pcOut",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Ply/PlyParser.cpp"
                  ,0x281,
                  "static bool Assimp::PLY::DOM::ParseInstance(IOStreamBuffer<char> &, DOM *, PLYImporter *)"
                 );
  }
  if (loader != (PLYImporter *)0x0) {
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)local_40);
    IOStreamBuffer<char>::getNextLine(streamBuffer,(vector<char,_std::allocator<char>_> *)local_40);
    pLVar2 = DefaultLogger::get();
    Logger::debug(pLVar2,"PLY::DOM::ParseInstance() begin");
    bVar1 = ParseHeader(p_pcOut,streamBuffer,(vector<char,_std::allocator<char>_> *)local_40,false);
    if (bVar1) {
      IOStreamBuffer<char>::getNextLine
                (streamBuffer,(vector<char,_std::allocator<char>_> *)local_40);
      bVar1 = ParseElementInstanceLists
                        (p_pcOut,streamBuffer,(vector<char,_std::allocator<char>_> *)local_40,
                         (PLYImporter *)
                         buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_);
      if (bVar1) {
        pLVar2 = DefaultLogger::get();
        Logger::debug(pLVar2,"PLY::DOM::ParseInstance() succeeded");
        streamBuffer_local._7_1_ = true;
      }
      else {
        pLVar2 = DefaultLogger::get();
        Logger::debug(pLVar2,"PLY::DOM::ParseInstance() failure");
        streamBuffer_local._7_1_ = false;
      }
    }
    else {
      pLVar2 = DefaultLogger::get();
      Logger::debug(pLVar2,"PLY::DOM::ParseInstance() failure");
      streamBuffer_local._7_1_ = false;
    }
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)local_40);
    return streamBuffer_local._7_1_;
  }
  __assert_fail("__null != loader",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Ply/PlyParser.cpp"
                ,0x282,
                "static bool Assimp::PLY::DOM::ParseInstance(IOStreamBuffer<char> &, DOM *, PLYImporter *)"
               );
}

Assistant:

bool PLY::DOM::ParseInstance(IOStreamBuffer<char> &streamBuffer, DOM* p_pcOut, PLYImporter* loader)
{
  ai_assert(NULL != p_pcOut);
  ai_assert(NULL != loader);

  std::vector<char> buffer;
  streamBuffer.getNextLine(buffer);

  ASSIMP_LOG_DEBUG("PLY::DOM::ParseInstance() begin");

  if (!p_pcOut->ParseHeader(streamBuffer, buffer, false))
  {
      ASSIMP_LOG_DEBUG("PLY::DOM::ParseInstance() failure");
    return false;
  }

  //get next line after header
  streamBuffer.getNextLine(buffer);
  if (!p_pcOut->ParseElementInstanceLists(streamBuffer, buffer, loader))
  {
      ASSIMP_LOG_DEBUG("PLY::DOM::ParseInstance() failure");
    return false;
  }
  ASSIMP_LOG_DEBUG("PLY::DOM::ParseInstance() succeeded");
  return true;
}